

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::pathChanged(QFileDialogPrivate *this,QString *newPath)

{
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QString newNativePath;
  QFileDialogComboBox *in_stack_fffffffffffffed8;
  HistoryItem *in_stack_fffffffffffffee0;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *this_00;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 *__s;
  undefined1 enable;
  QWidget *in_stack_fffffffffffffef0;
  qsizetype in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  byte local_d2;
  QUrl *in_stack_ffffffffffffff60;
  QSidebar *in_stack_ffffffffffffff68;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QUrl local_28;
  undefined1 local_20 [24];
  long local_8;
  
  enable = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QFileSystemModel::rootPath();
  QFileInfo::exists((QString *)local_20);
  QWidget::setEnabled(in_stack_fffffffffffffef0,(bool)enable);
  QString::~QString((QString *)0x75d67a);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QUrl::fromLocalFile((QString *)&local_28);
  QSidebar::selectUrl(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  QUrl::~QUrl(&local_28);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QFileDialogComboBox::history(in_stack_fffffffffffffed8);
  QFileDialog::setHistory
            ((QFileDialog *)in_stack_fffffffffffffee0,(QStringList *)in_stack_fffffffffffffed8);
  QList<QString>::~QList((QList<QString> *)0x75d710);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QDir::toNativeSeparators((QString *)&local_58);
  local_d2 = 1;
  if (-1 < in_RDI->currentHistoryLocation) {
    QList<QFileDialogPrivate::HistoryItem>::value
              ((QList<QFileDialogPrivate::HistoryItem> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               in_stack_fffffffffffffef8);
    local_d2 = ::operator!=(&in_stack_fffffffffffffee0->path,(QString *)in_stack_fffffffffffffed8);
    HistoryItem::~HistoryItem(in_stack_fffffffffffffee0);
  }
  if ((local_d2 & 1) != 0) {
    if (-1 < in_RDI->currentHistoryLocation) {
      saveHistorySelection
                ((QFileDialogPrivate *)
                 CONCAT17(local_d2,CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    }
    while( true ) {
      bVar1 = false;
      if (-1 < in_RDI->currentHistoryLocation) {
        lVar2 = (long)(in_RDI->currentHistoryLocation + 1);
        qVar3 = QList<QFileDialogPrivate::HistoryItem>::size(&in_RDI->currentHistory);
        bVar1 = lVar2 < qVar3;
      }
      if (!bVar1) break;
      QList<QFileDialogPrivate::HistoryItem>::removeLast
                ((QList<QFileDialogPrivate::HistoryItem> *)in_stack_fffffffffffffee0);
    }
    in_stack_fffffffffffffef0 = (QWidget *)&in_RDI->currentHistory;
    QString::QString(&in_stack_fffffffffffffee0->path,(QString *)in_stack_fffffffffffffed8);
    __s = &stack0xffffffffffffff60;
    memset(__s,0,0x18);
    enable = (undefined1)((ulong)__s >> 0x38);
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x75d89a);
    QList<QFileDialogPrivate::HistoryItem>::append
              ((QList<QFileDialogPrivate::HistoryItem> *)in_stack_fffffffffffffee0,
               (rvalue_ref)in_stack_fffffffffffffed8);
    HistoryItem::~HistoryItem(in_stack_fffffffffffffee0);
    in_RDI->currentHistoryLocation = in_RDI->currentHistoryLocation + 1;
  }
  this_00 = &in_RDI->qFileDialogUi;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_00);
  QList<QFileDialogPrivate::HistoryItem>::size(&in_RDI->currentHistory);
  QWidget::setEnabled(in_stack_fffffffffffffef0,(bool)enable);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_00);
  QWidget::setEnabled(in_stack_fffffffffffffef0,(bool)enable);
  QString::~QString((QString *)0x75d94e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::pathChanged(const QString &newPath)
{
    Q_Q(QFileDialog);
    qFileDialogUi->toParentButton->setEnabled(QFileInfo::exists(model->rootPath()));
    qFileDialogUi->sidebar->selectUrl(QUrl::fromLocalFile(newPath));
    q->setHistory(qFileDialogUi->lookInCombo->history());

    const QString newNativePath = QDir::toNativeSeparators(newPath);

    // equal paths indicate this was invoked by _q_navigateBack/Forward()
    if (currentHistoryLocation < 0 || currentHistory.value(currentHistoryLocation).path != newNativePath) {
        if (currentHistoryLocation >= 0)
            saveHistorySelection();
        while (currentHistoryLocation >= 0 && currentHistoryLocation + 1 < currentHistory.size()) {
            currentHistory.removeLast();
        }
        currentHistory.append({newNativePath, PersistentModelIndexList()});
        ++currentHistoryLocation;
    }
    qFileDialogUi->forwardButton->setEnabled(currentHistory.size() - currentHistoryLocation > 1);
    qFileDialogUi->backButton->setEnabled(currentHistoryLocation > 0);
}